

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<0,_6,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  float local_88;
  VecAccess<float,_4,_3> local_80;
  Matrix<float,_3,_2> local_68;
  Vector<float,_3> local_50 [2];
  float local_34;
  undefined1 local_30 [4];
  Type in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[1].m_data[1] = (float)in1Type;
  in0.m_data.m_data[1].m_data[2] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,6>((Mat2x3 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX
                      );
  }
  else {
    getInputValue<0,6>((Mat2x3 *)local_30,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX
                      );
  }
  if (in0.m_data.m_data[1].m_data[1] == 2.8026e-45) {
    local_88 = getInputValue<2,1>(evalCtx,1);
  }
  else {
    local_88 = getInputValue<0,1>(evalCtx,1);
  }
  local_34 = local_88;
  tcu::operator+(&local_68,(Matrix<float,_3,_2> *)local_30,local_88);
  reduceToVec3((MatrixCaseUtils *)local_50,&local_68);
  tcu::Vector<float,_4>::xyz(&local_80,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,local_50);
  tcu::Matrix<float,_3,_2>::~Matrix(&local_68);
  tcu::Matrix<float,_3,_2>::~Matrix((Matrix<float,_3,_2> *)local_30);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}